

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

void shift128ExtraRightJamming
               (uint64_t a0,uint64_t a1,uint64_t a2,int count,uint64_t *z0Ptr,uint64_t *z1Ptr,
               uint64_t *z2Ptr)

{
  uint64_t uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (count == 0) goto LAB_00b1e5c9;
  bVar2 = (byte)count;
  bVar3 = -bVar2 & 0x3f;
  if (count < 0x40) {
    uVar5 = a1 << bVar3;
    uVar4 = a0 << bVar3;
    a0 = a0 >> (bVar2 & 0x3f);
    a1 = a1 >> (bVar2 & 0x3f) | uVar4;
  }
  else {
    uVar5 = a1;
    uVar1 = a0;
    if (count != 0x40) {
      a2 = a2 | a1;
      if (0x7f < (uint)count) {
        uVar5 = (ulong)(a0 != 0);
        if (count == 0x80) {
          uVar5 = a0;
        }
        a0 = 0;
        a1 = 0;
        goto LAB_00b1e5b5;
      }
      uVar5 = a0 << (-bVar2 & 0x3f);
      uVar1 = a0 >> (bVar2 & 0x3f);
    }
    a1 = uVar1;
    a0 = 0;
  }
LAB_00b1e5b5:
  a2 = a2 != 0 | uVar5;
LAB_00b1e5c9:
  *z2Ptr = a2;
  *z1Ptr = a1;
  *z0Ptr = a0;
  return;
}

Assistant:

static inline void
 shift128ExtraRightJamming(
     uint64_t a0,
     uint64_t a1,
     uint64_t a2,
     int count,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr
 )
{
    uint64_t z0, z1, z2;
    int8_t negCount = ( - count ) & 63;

    if ( count == 0 ) {
        z2 = a2;
        z1 = a1;
        z0 = a0;
    }
    else {
        if ( count < 64 ) {
            z2 = a1<<negCount;
            z1 = ( a0<<negCount ) | ( a1>>count );
            z0 = a0>>count;
        }
        else {
            if ( count == 64 ) {
                z2 = a1;
                z1 = a0;
            }
            else {
                a2 |= a1;
                if ( count < 128 ) {
                    z2 = a0<<negCount;
                    z1 = a0>>( count & 63 );
                }
                else {
                    z2 = ( count == 128 ) ? a0 : ( a0 != 0 );
                    z1 = 0;
                }
            }
            z0 = 0;
        }
        z2 |= ( a2 != 0 );
    }
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}